

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  int in_EDX;
  stbrp_context *in_RSI;
  stbrp__findresult fr;
  int all_rects_packed;
  int i;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool bVar1;
  stbrp__findresult in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  int iVar3;
  
  iVar2 = 1;
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    *(int *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x14) = iVar3;
  }
  ImQsort((void *)CONCAT44(1,in_stack_ffffffffffffffe0),(size_t)in_stack_ffffffffffffffd0.prev_link,
          in_stack_ffffffffffffffd0._0_8_,
          (_func_int_void_ptr_void_ptr *)
          CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    if ((*(int *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x24) == 0) ||
       (*(int *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x20) == 0)) {
      *(undefined4 *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x18) = 0;
      *(undefined4 *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x1c) = 0;
    }
    else {
      in_stack_ffffffffffffffd0 = stbrp__skyline_pack_rectangle(in_RSI,in_EDX,iVar3);
      if (in_stack_ffffffffffffffd0.prev_link == (stbrp_node **)0x0) {
        *(undefined4 *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x18) = 0x7fffffff;
        *(undefined4 *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x1c) = 0x7fffffff;
      }
      else {
        *(int *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x1c) = in_stack_ffffffffffffffd0.x;
        *(int *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x18) = in_stack_ffffffffffffffd0.y;
      }
    }
  }
  ImQsort((void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
          (size_t)in_stack_ffffffffffffffd0.prev_link,in_stack_ffffffffffffffd0._0_8_,
          (_func_int_void_ptr_void_ptr *)
          CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    bVar1 = false;
    if (*(int *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x1c) == 0x7fffffff) {
      bVar1 = *(int *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x18) == 0x7fffffff;
    }
    *(uint *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x14) = (uint)((bVar1 ^ 0xffU) & 1);
    if (*(int *)((long)in_RSI->extra + (long)iVar3 * 0x18 + -0x14) == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}